

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::DecimalQuantity::shiftRight(DecimalQuantity *this,int32_t numDigits)

{
  int8_t *piVar1;
  ulong uVar2;
  
  if (this->usingBytes == true) {
    uVar2 = 0;
    if (numDigits < this->precision) {
      uVar2 = 0;
      do {
        piVar1 = (this->fBCD).bcdBytes.ptr;
        piVar1[uVar2] = piVar1[(long)numDigits + uVar2];
        uVar2 = uVar2 + 1;
      } while ((long)uVar2 < (long)this->precision - (long)numDigits);
    }
    if ((int)uVar2 < this->precision) {
      uVar2 = uVar2 & 0xffffffff;
      do {
        (this->fBCD).bcdBytes.ptr[uVar2] = '\0';
        uVar2 = uVar2 + 1;
      } while ((int)uVar2 < this->precision);
    }
  }
  else {
    (this->fBCD).bcdLong = (this->fBCD).bcdLong >> ((char)numDigits * '\x04' & 0x3fU);
  }
  this->scale = this->scale + numDigits;
  this->precision = this->precision - numDigits;
  return;
}

Assistant:

void DecimalQuantity::shiftRight(int32_t numDigits) {
    if (usingBytes) {
        int i = 0;
        for (; i < precision - numDigits; i++) {
            fBCD.bcdBytes.ptr[i] = fBCD.bcdBytes.ptr[i + numDigits];
        }
        for (; i < precision; i++) {
            fBCD.bcdBytes.ptr[i] = 0;
        }
    } else {
        fBCD.bcdLong >>= (numDigits * 4);
    }
    scale += numDigits;
    precision -= numDigits;
}